

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.h
# Opt level: O2

int64_t __thiscall MovDemuxer::getTrackDelay(MovDemuxer *this,int32_t pid)

{
  iterator iVar1;
  mapped_type *pmVar2;
  mapped_type mVar3;
  key_type_conflict local_14;
  
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
          ::find(&(this->m_firstTimecode)._M_t,&local_14);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->m_firstTimecode)._M_t._M_impl.super__Rb_tree_header) {
    mVar3 = 0;
  }
  else {
    pmVar2 = std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::
             operator[](&this->m_firstTimecode,&local_14);
    mVar3 = *pmVar2;
  }
  return mVar3;
}

Assistant:

int64_t getTrackDelay(const int32_t pid) override
    {
        return (m_firstTimecode.find(pid) != m_firstTimecode.end()) ? m_firstTimecode[pid] : 0;
    }